

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_cd.cpp
# Opt level: O0

void __thiscall CDDAFile::CDDAFile(CDDAFile *this,FileReader *reader)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  long endpos;
  ushort local_1e;
  DWORD discid;
  WORD track;
  FileReader *pFStack_18;
  DWORD chunk;
  FileReader *reader_local;
  CDDAFile *this_local;
  
  pFStack_18 = reader;
  reader_local = (FileReader *)this;
  CDSong::CDSong(&this->super_CDSong);
  (this->super_CDSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__CDDAFile_00b65548;
  iVar2 = (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[3])();
  lVar4 = FileReader::GetLength(pFStack_18);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,0xc,1);
  while( true ) {
    iVar3 = (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[3])();
    if (CONCAT44(extraout_var,iVar2) + -8 + lVar4 <= CONCAT44(extraout_var_00,iVar3)) {
      return;
    }
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&discid,4);
    if (discid == 0x20746d66) break;
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&discid,4);
    (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,(ulong)discid,1);
  }
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,6,1);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,&local_1e,2);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_18,(long)&endpos + 4,4);
  bVar1 = CD_InitID(endpos._4_4_,-1);
  if (!bVar1) {
    return;
  }
  bVar1 = CD_CheckTrack((uint)local_1e);
  if (!bVar1) {
    return;
  }
  (this->super_CDSong).m_Inited = true;
  (this->super_CDSong).m_Track = (uint)local_1e;
  return;
}

Assistant:

CDDAFile::CDDAFile (FileReader &reader)
	: CDSong ()
{
	DWORD chunk;
	WORD track;
	DWORD discid;
	long endpos = reader.Tell() + reader.GetLength() - 8;

	// I_RegisterSong already identified this as a CDDA file, so we
	// just need to check the contents we're interested in.
	reader.Seek(12, SEEK_CUR);

	while (reader.Tell() < endpos)
	{
        reader.Read(&chunk, 4);
		if (chunk != (('f')|(('m')<<8)|(('t')<<16)|((' ')<<24)))
		{
            reader.Read(&chunk, 4);
            reader.Seek(chunk, SEEK_CUR);
		}
		else
		{
            reader.Seek(6, SEEK_CUR);
            reader.Read(&track, 2);
            reader.Read(&discid, 4);

			if (CD_InitID (discid) && CD_CheckTrack (track))
			{
				m_Inited = true;
				m_Track = track;
			}
			return;
		}
	}
}